

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_build_backward_expand
               (ggml_context *ctx_static,ggml_context *ctx_compute,ggml_cgraph *cgraph,
               _Bool accumulate)

{
  _Bool _Var1;
  ggml_unary_op gVar2;
  size_t sVar3;
  ggml_tensor *pgVar4;
  byte in_CL;
  long in_RDX;
  int i_2;
  size_t igrad;
  int j;
  ggml_unary_op uop;
  _Bool ignore_src [10];
  _Bool node_needs_grad;
  ggml_tensor *node_1;
  int i_1;
  ggml_tensor *node;
  int i;
  _Bool any_loss;
  _Bool any_params;
  _Bool *grads_needed;
  int n_nodes_f;
  _Bool *in_stack_00000578;
  int in_stack_00000584;
  ggml_cgraph *in_stack_00000588;
  ggml_context *in_stack_00000590;
  ggml_tensor *in_stack_ffffffffffffff78;
  ggml_context *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  ggml_hash_set *in_stack_ffffffffffffff98;
  int local_60;
  byte local_58 [15];
  bool local_49;
  int *local_48;
  int local_3c;
  long local_38;
  int local_30;
  bool local_2a;
  bool local_29;
  ggml_context *local_28;
  int local_20;
  byte local_19;
  long local_18;
  
  local_19 = in_CL & 1;
  if (*(int *)(in_RDX + 4) < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16c0,"GGML_ASSERT(%s) failed","cgraph->n_nodes > 0");
  }
  if (*(long *)(in_RDX + 0x18) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16c1,"GGML_ASSERT(%s) failed","cgraph->grads");
  }
  if (*(long *)(in_RDX + 0x20) == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16c2,"GGML_ASSERT(%s) failed","cgraph->grad_accs");
  }
  local_20 = *(int *)(in_RDX + 4);
  local_18 = in_RDX;
  memset(*(void **)(in_RDX + 0x18),0,*(long *)(in_RDX + 0x30) << 3);
  memset(*(void **)(local_18 + 0x20),0,*(long *)(local_18 + 0x30) << 3);
  local_28 = (ggml_context *)calloc(*(size_t *)(local_18 + 0x30),1);
  local_29 = false;
  local_2a = false;
  for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
    local_38 = *(long *)(*(long *)(local_18 + 0x10) + (long)local_30 * 8);
    in_stack_ffffffffffffff93 = true;
    if (local_29 == false) {
      in_stack_ffffffffffffff93 = (*(uint *)(local_38 + 0x94) & 4) != 0;
    }
    local_29 = (bool)in_stack_ffffffffffffff93;
    in_stack_ffffffffffffff92 = true;
    if (local_2a == false) {
      in_stack_ffffffffffffff92 = (*(uint *)(local_38 + 0x94) & 8) != 0;
    }
    local_2a = (bool)in_stack_ffffffffffffff92;
  }
  if (local_29 == false) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16d2,"GGML_ASSERT(%s) failed",
               "any_params && \"no trainable parameters found, did you forget to call ggml_set_param?\""
              );
  }
  if (local_2a == false) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16d3,"GGML_ASSERT(%s) failed",
               "any_loss && \"no training loss found, did you forget to call ggml_set_loss?\"");
  }
  local_3c = 0;
  do {
    iVar6 = local_20;
    if (local_20 <= local_3c) {
      while (iVar6 = iVar6 + -1, -1 < iVar6) {
        ggml_compute_backward
                  (in_stack_00000590,in_stack_00000588,in_stack_00000584,in_stack_00000578);
      }
      free(local_28);
      return;
    }
    local_48 = *(int **)(*(long *)(local_18 + 0x10) + (long)local_3c * 8);
    if (*local_48 != 0x1a) {
      uVar5 = true;
      if ((local_48[0x25] & 4U) == 0) {
        uVar5 = (local_48[0x25] & 8U) != 0;
      }
      local_49 = (bool)uVar5;
      local_58[8] = 0;
      local_58[9] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      iVar6 = local_48[0x14];
      if (((iVar6 == 0x20) || (iVar6 - 0x26U < 2)) || (iVar6 == 0x2d)) {
        local_58[0] = 0;
        local_58[1] = 1;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_58[5] = 0;
        local_58[6] = 0;
        local_58[7] = 0;
      }
      else if (iVar6 - 0x31U < 2) {
        local_58[0] = 1;
        local_58[1] = 0;
        local_58[2] = 0;
        local_58[3] = 0;
        local_58[4] = 0;
        local_58[5] = 0;
        local_58[6] = 0;
        local_58[7] = 0;
      }
      else if ((iVar6 == 0x4a) &&
              ((gVar2 = ggml_get_unary_op((ggml_tensor *)0x1549f7), gVar2 == GGML_UNARY_OP_SGN ||
               (gVar2 == GGML_UNARY_OP_STEP)))) {
        local_58[0] = 1;
      }
      for (local_60 = 0; local_60 < 10; local_60 = local_60 + 1) {
        if (((*(long *)(local_48 + (long)local_60 * 2 + 0x26) != 0) &&
            ((local_58[local_60] & 1) == 0)) &&
           (in_stack_ffffffffffffff80 = local_28,
           sVar3 = ggml_hash_find(in_stack_ffffffffffffff98,
                                  (ggml_tensor *)
                                  CONCAT44(in_stack_ffffffffffffff94,
                                           CONCAT13(in_stack_ffffffffffffff93,
                                                    CONCAT12(in_stack_ffffffffffffff92,
                                                             CONCAT11(uVar5,
                                                  in_stack_ffffffffffffff90))))),
           (*(byte *)((long)&in_stack_ffffffffffffff80->mem_size + sVar3) & 1) != 0)) {
          if ((**(int **)(local_48 + (long)local_60 * 2 + 0x26) != 0) &&
             (**(int **)(local_48 + (long)local_60 * 2 + 0x26) != 1)) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                       ,0x16fc,"GGML_ASSERT(%s) failed",
                       "node->src[j]->type == GGML_TYPE_F32 || node->src[j]->type == GGML_TYPE_F16")
            ;
          }
          local_49 = true;
          break;
        }
      }
      if ((local_49 & 1U) != 0) {
        if (((((*(long *)(local_48 + 0x3a) != 0) && (local_48[0x14] != 0x20)) &&
             (local_48[0x14] != 0x23)) && ((local_48[0x14] != 0x22 && (local_48[0x14] != 0x24)))) &&
           (local_48[0x14] != 0x25)) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x1706,"GGML_ASSERT(%s) failed",
                     "!node->view_src || node->op == GGML_OP_CPY || node->op == GGML_OP_VIEW || node->op == GGML_OP_RESHAPE || node->op == GGML_OP_PERMUTE || node->op == GGML_OP_TRANSPOSE"
                    );
        }
        in_stack_ffffffffffffff98 =
             (ggml_hash_set *)
             ggml_hash_find(in_stack_ffffffffffffff98,
                            (ggml_tensor *)
                            CONCAT44(in_stack_ffffffffffffff94,
                                     CONCAT13(in_stack_ffffffffffffff93,
                                              CONCAT12(in_stack_ffffffffffffff92,
                                                       CONCAT11(uVar5,in_stack_ffffffffffffff90)))))
        ;
        if (in_stack_ffffffffffffff98 == (ggml_hash_set *)0xffffffffffffffff) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x1709,"GGML_ASSERT(%s) failed","igrad != GGML_HASHSET_FULL");
        }
        _Var1 = ggml_bitset_get(*(ggml_bitset_t **)(local_18 + 0x38),
                                (size_t)in_stack_ffffffffffffff98);
        if (!_Var1) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c"
                     ,0x170a,"GGML_ASSERT(%s) failed",
                     "ggml_bitset_get(cgraph->visited_hash_set.used, igrad)");
        }
        if ((((local_19 & 1) != 0) && ((local_48[0x25] & 4U) != 0)) || ((local_48[0x25] & 8U) != 0))
        {
          pgVar4 = ggml_dup_tensor(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          *(ggml_tensor **)(*(long *)(local_18 + 0x20) + (long)in_stack_ffffffffffffff98 * 8) =
               pgVar4;
          *(undefined8 *)(*(long *)(local_18 + 0x18) + (long)in_stack_ffffffffffffff98 * 8) =
               *(undefined8 *)(*(long *)(local_18 + 0x20) + (long)in_stack_ffffffffffffff98 * 8);
          ggml_format_name(*(ggml_tensor **)
                            (*(long *)(local_18 + 0x20) + (long)in_stack_ffffffffffffff98 * 8),
                           "grad acc for %s",local_48 + 0x40);
        }
        *(undefined1 *)((long)&in_stack_ffffffffffffff98->size + (long)&local_28->mem_size) = 1;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void ggml_build_backward_expand(
        struct ggml_context * ctx_static,
        struct ggml_context * ctx_compute,
        struct ggml_cgraph  * cgraph,
        bool                  accumulate) {
    GGML_ASSERT(cgraph->n_nodes > 0);
    GGML_ASSERT(cgraph->grads);
    GGML_ASSERT(cgraph->grad_accs);

    const int n_nodes_f = cgraph->n_nodes;

    memset(cgraph->grads,     0, cgraph->visited_hash_set.size*sizeof(struct ggml_tensor *));
    memset(cgraph->grad_accs, 0, cgraph->visited_hash_set.size*sizeof(struct ggml_tensor *));
    bool * grads_needed = calloc(cgraph->visited_hash_set.size, sizeof(bool));

    {
        bool any_params = false;
        bool any_loss   = false;
        for (int i = 0; i < n_nodes_f; ++i) {
            struct ggml_tensor * node = cgraph->nodes[i];
            any_params = any_params || (node->flags & GGML_TENSOR_FLAG_PARAM);
            any_loss   = any_loss   || (node->flags & GGML_TENSOR_FLAG_LOSS);
        }
        GGML_ASSERT(any_params && "no trainable parameters found, did you forget to call ggml_set_param?");
        GGML_ASSERT(any_loss && "no training loss found, did you forget to call ggml_set_loss?");
    }

    for (int i = 0; i < n_nodes_f; ++i) {
        struct ggml_tensor * node = cgraph->nodes[i];

        if (node->type == GGML_TYPE_I32) {
            continue;
        }

        bool node_needs_grad = (node->flags & GGML_TENSOR_FLAG_PARAM) || (node->flags & GGML_TENSOR_FLAG_LOSS);
        bool ignore_src[GGML_MAX_SRC] = {false};
        switch (node->op) {
            // gradients in node->src[0] for one reason or another have no effect on output gradients
            case GGML_OP_IM2COL:      // only used for its shape
            case GGML_OP_IM2COL_BACK: // same as IM2COL
                ignore_src[0] = true;
                break;
            case GGML_OP_UNARY: {
                const enum ggml_unary_op uop = ggml_get_unary_op(node);
                // SGN and STEP unary ops are piecewise constant
                if (uop == GGML_UNARY_OP_SGN || uop == GGML_UNARY_OP_STEP) {
                    ignore_src[0] = true;
                }
            } break;

            // gradients in node->src[1] for one reason or another have no effect on output gradients
            case GGML_OP_CPY:           // gradients in CPY target are irrelevant
            case GGML_OP_GET_ROWS:      // row indices not differentiable
            case GGML_OP_GET_ROWS_BACK: // same as for GET_ROWS
            case GGML_OP_ROPE:          // positions not differentiable
                ignore_src[1] = true;
                break;

            default:
                break;
        }
        for (int j = 0; j < GGML_MAX_SRC; ++j) {
            if (!node->src[j] || ignore_src[j] || !grads_needed[ggml_hash_find(&cgraph->visited_hash_set, node->src[j])]) {
                continue;
            }
            GGML_ASSERT(node->src[j]->type == GGML_TYPE_F32 || node->src[j]->type == GGML_TYPE_F16);
            node_needs_grad = true;
            break;
        }
        if (!node_needs_grad) {
            continue;
        }

        // inplace operations are currently not supported
        GGML_ASSERT(!node->view_src || node->op == GGML_OP_CPY || node->op == GGML_OP_VIEW ||
            node->op == GGML_OP_RESHAPE || node->op == GGML_OP_PERMUTE || node->op == GGML_OP_TRANSPOSE);

        const size_t igrad = ggml_hash_find(&cgraph->visited_hash_set, node);
        GGML_ASSERT(igrad != GGML_HASHSET_FULL);
        GGML_ASSERT(ggml_bitset_get(cgraph->visited_hash_set.used, igrad));
        if ((accumulate && (node->flags & GGML_TENSOR_FLAG_PARAM)) || (node->flags & GGML_TENSOR_FLAG_LOSS)) {
            cgraph->grad_accs[igrad] = ggml_dup_tensor(ctx_static, node);
            cgraph->grads[igrad]     = cgraph->grad_accs[igrad];
            ggml_format_name(cgraph->grad_accs[igrad], "grad acc for %s", node->name);
        }
        grads_needed[igrad] = true;
    }

    for (int i = n_nodes_f - 1; i >= 0; --i) {
        // inplace operations to add gradients are not created by ggml_compute_backward except for gradient accumulation
        // use allocator to automatically make inplace operations
        ggml_compute_backward(ctx_compute, cgraph, i, grads_needed);
    }

    free(grads_needed);
}